

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# float_math.cpp
# Opt level: O3

void fm_eulerMatrix(float ax,float ay,float az,float *matrix)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  undefined1 auVar10 [16];
  float quat [4];
  float local_18;
  undefined4 local_14;
  undefined4 local_10;
  undefined4 local_c;
  
  fVar4 = cosf(ax * 0.5);
  fVar5 = cosf(ay * 0.5);
  fVar6 = cosf(az * 0.5);
  fVar7 = sinf(ax * 0.5);
  fVar8 = sinf(ay * 0.5);
  fVar9 = sinf(az * 0.5);
  auVar10 = ZEXT416((uint)fVar4);
  auVar1 = vfmadd231ss_fma(ZEXT416((uint)(fVar7 * fVar5 * fVar9)),auVar10,
                           ZEXT416((uint)(fVar6 * fVar8)));
  auVar3 = vfmsub231ss_fma(ZEXT416((uint)(fVar4 * fVar8 * fVar9)),ZEXT416((uint)fVar7),
                           ZEXT416((uint)(fVar5 * fVar6)));
  auVar2 = vfmadd231ss_fma(ZEXT416((uint)(fVar7 * fVar8 * fVar9)),auVar10,
                           ZEXT416((uint)(fVar5 * fVar6)));
  auVar10 = vfmsub231ss_fma(ZEXT416((uint)(fVar6 * fVar8 * fVar7)),auVar10,
                            ZEXT416((uint)(fVar5 * fVar9)));
  local_18 = auVar3._0_4_;
  local_14 = auVar1._0_4_;
  local_10 = auVar10._0_4_;
  local_c = auVar2._0_4_;
  fm_quatToMatrix(&local_18,matrix);
  return;
}

Assistant:

void fm_eulerMatrix(float ax,float ay,float az,float *matrix) // convert euler (in radians) to a dest 4x4 matrix (translation set to zero)
{
  float quat[4];
  fm_eulerToQuat(ax,ay,az,quat);
  fm_quatToMatrix(quat,matrix);
}